

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_handle_hello(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_iovec_t message)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  undefined8 uVar4;
  int iVar5;
  st_ptls_key_schedule_t *psVar6;
  st_ptls_early_data_receiver_t *psVar7;
  size_t len;
  size_t sVar8;
  uint8_t *msg;
  ptls_iovec_t pVar9;
  size_t body_size_21;
  size_t body_size_22;
  size_t body_size_23;
  size_t local_648;
  size_t datalen;
  uint8_t data [226];
  size_t body_start_23;
  size_t capacity_23;
  long lStack_530;
  uint16_t _v_12;
  size_t body_start_22;
  size_t capacity_22;
  long local_518;
  size_t mess_start_4;
  size_t body_start_21;
  size_t capacity_21;
  size_t local_4f8;
  size_t rec_start_2;
  size_t body_size_16;
  size_t body_size_17;
  size_t body_size_18;
  size_t body_size_20;
  size_t body_start_20;
  size_t capacity_20;
  size_t body_size_19;
  size_t body_start_19;
  size_t capacity_19;
  size_t i;
  size_t body_start_18;
  size_t capacity_18;
  long local_488;
  size_t body_start_17;
  size_t capacity_17;
  long local_470;
  size_t mess_start_3;
  size_t body_start_16;
  size_t capacity_16;
  size_t local_450;
  size_t rec_start_1;
  size_t body_size_11;
  size_t body_size_12;
  size_t body_size_13;
  size_t body_size_15;
  size_t body_start_15;
  size_t capacity_15;
  ulong uStack_410;
  uint16_t _v_11;
  size_t body_size_14;
  size_t body_start_14;
  size_t capacity_14;
  long lStack_3f0;
  uint16_t _v_10;
  size_t body_start_13;
  size_t capacity_13;
  size_t body_start_12;
  size_t capacity_12;
  long local_3c8;
  size_t mess_start_2;
  size_t body_start_11;
  size_t capacity_11;
  size_t local_3a8;
  size_t rec_start;
  size_t body_size_5;
  size_t body_size_6;
  size_t body_size_7;
  size_t body_size_10;
  long lStack_378;
  uint16_t _v_9;
  size_t body_start_10;
  size_t capacity_10;
  ulong uStack_360;
  uint16_t _v_8;
  size_t body_size_8;
  size_t body_size_9;
  size_t body_start_9;
  size_t capacity_9;
  long lStack_338;
  uint16_t _v_7;
  size_t body_start_8;
  size_t capacity_8;
  long lStack_320;
  uint16_t _v_6;
  size_t body_start_7;
  size_t capacity_7;
  uint16_t _v_5;
  long lStack_308;
  uint16_t _v_4;
  size_t body_start_6;
  size_t capacity_6;
  long local_2f0;
  size_t mess_start_1;
  size_t body_start_5;
  size_t capacity_5;
  ulong local_2d0;
  size_t body_size;
  size_t body_size_1;
  size_t body_size_2;
  size_t body_size_4;
  size_t body_start_4;
  size_t capacity_4;
  ulong uStack_298;
  uint16_t _v_3;
  size_t body_size_3;
  long lStack_288;
  uint16_t _v_2;
  size_t body_start_3;
  size_t capacity_3;
  long lStack_270;
  uint16_t _v_1;
  size_t body_start_2;
  size_t capacity_2;
  long lStack_258;
  uint16_t _v;
  size_t body_start_1;
  size_t capacity_1;
  undefined8 local_240;
  size_t mess_start;
  size_t body_start;
  size_t capacity;
  ptls_iovec_t local_220;
  int local_20c;
  undefined1 local_208 [4];
  int ret;
  uint8_t finished_key [64];
  uint8_t *local_1c0;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  void *signer_data;
  _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t *signer;
  size_t sStack_188;
  uint16_t sign_algorithm;
  size_t psk_index;
  size_t num_certs;
  ptls_iovec_t *certs;
  undefined1 local_168 [4];
  anon_enum_32 mode;
  st_ptls_client_hello_t ch;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  sVar8 = message.len;
  msg = message.base;
  num_certs = 0;
  psk_index = 0;
  sStack_188 = 0xffffffffffffffff;
  signer._6_2_ = 0;
  signer_data = (void *)0x0;
  pubkey.len = 0;
  ch.psk._176_8_ = sendbuf;
  memset(&ecdh_secret.len,0,0x10);
  memset(&local_1c0,0,0x10);
  if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
    __assert_fail("tls->key_schedule == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x69c,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
  }
  local_20c = decode_client_hello(tls,(st_ptls_client_hello_t *)local_168,msg + 4,msg + sVar8);
  if (local_20c != 0) goto LAB_0011b13b;
  psVar6 = key_schedule_new(tls->cipher_suite->hash);
  tls->key_schedule = psVar6;
  if (tls->ctx->require_dhe_on_psk != 0) {
    ch.psk.identities.count._0_4_ = (uint)ch.psk.identities.count & 0xfffffffe;
  }
  if (((ch.cookie.len == 0) || (((uint)ch.psk.identities.count & 3) == 0)) ||
     (tls->ctx->decrypt_ticket == (ptls_encrypt_ticket_t *)0x0)) {
    key_schedule_update_hash(tls->key_schedule,msg,sVar8);
  }
  else {
    key_schedule_update_hash(tls->key_schedule,msg,ch.cookie.len - (long)msg);
    local_20c = try_psk_handshake(tls,&stack0xfffffffffffffe78,(st_ptls_client_hello_t *)local_168);
    if (local_20c != 0) goto LAB_0011b13b;
    key_schedule_update_hash
              (tls->key_schedule,(uint8_t *)ch.cookie.len,(size_t)(msg + (sVar8 - ch.cookie.len)));
  }
  if (sStack_188 == 0xffffffffffffffff) {
    psVar6 = tls->key_schedule;
    local_220 = ptls_iovec_init((void *)0x0,0);
    key_schedule_extract(psVar6,local_220);
    certs._4_4_ = 0;
  }
  else if (((uint)ch.psk.identities.count & 1) == 0) {
    if (((uint)ch.psk.identities.count & 2) == 0) {
      __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                    ,0x6b9,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
    }
    certs._4_4_ = 2;
  }
  else {
    certs._4_4_ = 1;
  }
  if (((ch.psk.identities.count._4_4_ != 0) && (tls->ctx->max_early_data_size != 0)) &&
     (sStack_188 == 0)) {
    psVar7 = (st_ptls_early_data_receiver_t *)malloc(0x40);
    (tls->field_7).server.early_data = psVar7;
    if (psVar7 == (st_ptls_early_data_receiver_t *)0x0) {
      local_20c = 0x201;
      goto LAB_0011b13b;
    }
    local_20c = setup_traffic_protection(tls,tls->cipher_suite,0,"client early traffic secret");
    if (local_20c != 0) goto LAB_0011b13b;
    local_20c = 0;
  }
  if ((certs._4_4_ == 1) ||
     ((ptls_key_exchange_algorithm_t *)ch.signature_algorithms.count != &key_exchange_no_match)) {
    if (certs._4_4_ == 0) {
      local_20c = (*tls->ctx->lookup_certificate->cb)
                            (tls->ctx->lookup_certificate,tls,(uint16_t *)((long)&signer + 6),
                             (_func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t **)&signer_data,
                             (void **)&pubkey.len,(ptls_iovec_t **)&num_certs,&psk_index,
                             tls->server_name,(uint16_t *)&ch.negotiated_group,
                             ch.signature_algorithms.list._24_8_);
      if (local_20c != 0) goto LAB_0011b13b;
      if (signer._6_2_ == 0) {
        __assert_fail("sign_algorithm != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                      ,0x6e4,"int server_handle_hello(ptls_t *, ptls_buffer_t *, ptls_iovec_t)");
      }
      local_20c = 0;
    }
    if (certs._4_4_ != 1) {
      local_20c = (**(code **)(ch.signature_algorithms.count + 0x10))
                            (&ecdh_secret.len,&local_1c0,ch.key_share.algorithm,
                             ch.key_share.peer.base);
      if (local_20c != 0) goto LAB_0011b13b;
      local_20c = 0;
    }
    capacity_5._5_1_ = 0x16;
    capacity_5._6_1_ = 3;
    capacity_5._7_1_ = 1;
    local_20c = ptls_buffer__do_pushv
                          ((ptls_buffer_t *)ch.psk._176_8_,(void *)((long)&capacity_5 + 5),3);
    if (local_20c == 0) {
      body_start_5 = 2;
      local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
      if (local_20c == 0) {
        mess_start_1 = *(size_t *)(ch.psk._176_8_ + 0x10);
        local_2f0 = *(long *)(ch.psk._176_8_ + 0x10);
        capacity_6._7_1_ = 2;
        local_20c = ptls_buffer__do_pushv
                              ((ptls_buffer_t *)ch.psk._176_8_,(void *)((long)&capacity_6 + 7),1);
        if (local_20c == 0) {
          body_start_6 = 3;
          local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",3);
          if (local_20c == 0) {
            lStack_308 = *(long *)(ch.psk._176_8_ + 0x10);
            capacity_7._6_2_ = 0x7f12;
            capacity_7._4_1_ = 0x7f;
            capacity_7._5_1_ = 0x12;
            local_20c = ptls_buffer__do_pushv
                                  ((ptls_buffer_t *)ch.psk._176_8_,(void *)((long)&capacity_7 + 4),2
                                  );
            if ((local_20c == 0) &&
               (local_20c = ptls_buffer_reserve((ptls_buffer_t *)ch.psk._176_8_,0x20),
               local_20c == 0)) {
              (*tls->ctx->random_bytes)
                        ((void *)(*(long *)ch.psk._176_8_ + *(long *)(ch.psk._176_8_ + 0x10)),0x20);
              *(long *)(ch.psk._176_8_ + 0x10) = *(long *)(ch.psk._176_8_ + 0x10) + 0x20;
              capacity_7._2_2_ = tls->cipher_suite->id;
              capacity_7._0_1_ = (undefined1)(capacity_7._2_2_ >> 8);
              capacity_7._1_1_ = (undefined1)capacity_7._2_2_;
              local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,&capacity_7,2);
              if (local_20c == 0) {
                body_start_7 = 2;
                local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
                if (local_20c == 0) {
                  lStack_320 = *(long *)(ch.psk._176_8_ + 0x10);
                  if (certs._4_4_ != 1) {
                    capacity_8._6_2_ = 0x28;
                    capacity_8._4_1_ = 0;
                    capacity_8._5_1_ = 0x28;
                    local_20c = ptls_buffer__do_pushv
                                          ((ptls_buffer_t *)ch.psk._176_8_,
                                           (void *)((long)&capacity_8 + 4),2);
                    if (local_20c != 0) goto LAB_0011b13b;
                    body_start_8 = 2;
                    local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
                    if (local_20c != 0) goto LAB_0011b13b;
                    lStack_338 = *(long *)(ch.psk._176_8_ + 0x10);
                    capacity_9._6_2_ = *(undefined2 *)ch.signature_algorithms.count;
                    capacity_9._4_1_ = (undefined1)((ushort)capacity_9._6_2_ >> 8);
                    capacity_9._5_1_ = (undefined1)capacity_9._6_2_;
                    local_20c = ptls_buffer__do_pushv
                                          ((ptls_buffer_t *)ch.psk._176_8_,
                                           (void *)((long)&capacity_9 + 4),2);
                    if (local_20c != 0) goto LAB_0011b13b;
                    body_start_9 = 2;
                    local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
                    if (local_20c != 0) goto LAB_0011b13b;
                    body_size_9 = *(size_t *)(ch.psk._176_8_ + 0x10);
                    local_20c = ptls_buffer__do_pushv
                                          ((ptls_buffer_t *)ch.psk._176_8_,(void *)ecdh_secret.len,
                                           (size_t)pubkey.base);
                    if (local_20c != 0) goto LAB_0011b13b;
                    body_size_8 = *(long *)(ch.psk._176_8_ + 0x10) - body_size_9;
                    for (; body_start_9 != 0; body_start_9 = body_start_9 - 1) {
                      *(char *)(*(long *)ch.psk._176_8_ + (body_size_9 - body_start_9)) =
                           (char)(body_size_8 >> (((char)body_start_9 + -1) * '\b' & 0x3fU));
                    }
                    uStack_360 = *(long *)(ch.psk._176_8_ + 0x10) - lStack_338;
                    for (; body_start_8 != 0; body_start_8 = body_start_8 - 1) {
                      *(char *)(*(long *)ch.psk._176_8_ + (lStack_338 - body_start_8)) =
                           (char)(uStack_360 >> (((char)body_start_8 + -1) * '\b' & 0x3fU));
                    }
                  }
                  local_20c = 0;
                  if (certs._4_4_ != 0) {
                    capacity_10._6_2_ = 0x29;
                    capacity_10._4_1_ = 0;
                    capacity_10._5_1_ = 0x29;
                    local_20c = ptls_buffer__do_pushv
                                          ((ptls_buffer_t *)ch.psk._176_8_,
                                           (void *)((long)&capacity_10 + 4),2);
                    if (local_20c != 0) goto LAB_0011b13b;
                    body_start_10 = 2;
                    local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
                    if (local_20c != 0) goto LAB_0011b13b;
                    lStack_378 = *(long *)(ch.psk._176_8_ + 0x10);
                    body_size_10._6_2_ = (undefined2)sStack_188;
                    body_size_10._4_1_ = (undefined1)(sStack_188 >> 8);
                    body_size_10._5_1_ = (undefined1)sStack_188;
                    local_20c = ptls_buffer__do_pushv
                                          ((ptls_buffer_t *)ch.psk._176_8_,
                                           (void *)((long)&body_size_10 + 4),2);
                    if (local_20c != 0) goto LAB_0011b13b;
                    body_size_7 = *(long *)(ch.psk._176_8_ + 0x10) - lStack_378;
                    for (; body_start_10 != 0; body_start_10 = body_start_10 - 1) {
                      *(char *)(*(long *)ch.psk._176_8_ + (lStack_378 - body_start_10)) =
                           (char)(body_size_7 >> (((char)body_start_10 + -1) * '\b' & 0x3fU));
                    }
                  }
                  local_20c = 0;
                  body_size_6 = *(long *)(ch.psk._176_8_ + 0x10) - lStack_320;
                  for (; body_start_7 != 0; body_start_7 = body_start_7 - 1) {
                    *(char *)(*(long *)ch.psk._176_8_ + (lStack_320 - body_start_7)) =
                         (char)(body_size_6 >> (((char)body_start_7 + -1) * '\b' & 0x3fU));
                  }
                  body_size_5 = *(long *)(ch.psk._176_8_ + 0x10) - lStack_308;
                  for (; body_start_6 != 0; body_start_6 = body_start_6 - 1) {
                    *(char *)(*(long *)ch.psk._176_8_ + (lStack_308 - body_start_6)) =
                         (char)(body_size_5 >> (((char)body_start_6 + -1) * '\b' & 0x3fU));
                  }
                  if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                    key_schedule_update_hash
                              (tls->key_schedule,(uint8_t *)(*(long *)ch.psk._176_8_ + local_2f0),
                               *(long *)(ch.psk._176_8_ + 0x10) - local_2f0);
                  }
                  rec_start = *(long *)(ch.psk._176_8_ + 0x10) - mess_start_1;
                  for (; body_start_5 != 0; body_start_5 = body_start_5 - 1) {
                    *(char *)(*(long *)ch.psk._176_8_ + (mess_start_1 - body_start_5)) =
                         (char)(rec_start >> (((char)body_start_5 + -1) * '\b' & 0x3fU));
                  }
                  pVar9.len = (size_t)ecdh_secret.base;
                  pVar9.base = local_1c0;
                  key_schedule_extract(tls->key_schedule,pVar9);
                  local_20c = setup_traffic_protection
                                        (tls,tls->cipher_suite,1,"server handshake traffic secret");
                  if (local_20c == 0) {
                    if ((tls->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0) {
                      local_20c = setup_traffic_protection
                                            (tls,tls->cipher_suite,0,
                                             "client handshake traffic secret");
                      if (local_20c != 0) goto LAB_0011b13b;
                      if (ch.psk.identities.count._4_4_ != 0) {
                        *(byte *)&(tls->field_7).server = *(byte *)&(tls->field_7).server & 0xfd | 2
                        ;
                      }
                    }
                    else {
                      local_20c = derive_secret(tls->key_schedule,(tls->field_7).server.early_data,
                                                "client handshake traffic secret");
                      if (local_20c != 0) goto LAB_0011b13b;
                    }
                    local_20c = 0;
                    local_3a8 = *(size_t *)(ch.psk._176_8_ + 0x10);
                    capacity_11._5_1_ = 0x16;
                    capacity_11._6_1_ = 3;
                    capacity_11._7_1_ = 1;
                    local_20c = ptls_buffer__do_pushv
                                          ((ptls_buffer_t *)ch.psk._176_8_,
                                           (void *)((long)&capacity_11 + 5),3);
                    if (local_20c == 0) {
                      body_start_11 = 2;
                      local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
                      if (local_20c == 0) {
                        mess_start_2 = *(size_t *)(ch.psk._176_8_ + 0x10);
                        local_3c8 = *(long *)(ch.psk._176_8_ + 0x10);
                        capacity_12._7_1_ = 8;
                        local_20c = ptls_buffer__do_pushv
                                              ((ptls_buffer_t *)ch.psk._176_8_,
                                               (void *)((long)&capacity_12 + 7),1);
                        if (local_20c == 0) {
                          body_start_12 = 3;
                          local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",3);
                          if (local_20c == 0) {
                            capacity_13 = *(size_t *)(ch.psk._176_8_ + 0x10);
                            body_start_13 = 2;
                            local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
                            if (local_20c == 0) {
                              lStack_3f0 = *(long *)(ch.psk._176_8_ + 0x10);
                              if (tls->server_name != (char *)0x0) {
                                capacity_14._6_2_ = 0;
                                capacity_14._4_1_ = 0;
                                capacity_14._5_1_ = 0;
                                local_20c = ptls_buffer__do_pushv
                                                      ((ptls_buffer_t *)ch.psk._176_8_,
                                                       (void *)((long)&capacity_14 + 4),2);
                                if (local_20c != 0) goto LAB_0011b13b;
                                body_start_14 = 2;
                                local_20c = ptls_buffer__do_pushv
                                                      ((ptls_buffer_t *)ch.psk._176_8_,"",2);
                                if (local_20c != 0) goto LAB_0011b13b;
                                body_size_14 = *(size_t *)(ch.psk._176_8_ + 0x10);
                                uStack_410 = *(long *)(ch.psk._176_8_ + 0x10) - body_size_14;
                                for (; body_start_14 != 0; body_start_14 = body_start_14 - 1) {
                                  *(char *)(*(long *)ch.psk._176_8_ + (body_size_14 - body_start_14)
                                           ) = (char)(uStack_410 >>
                                                     (((char)body_start_14 + -1) * '\b' & 0x3fU));
                                }
                              }
                              local_20c = 0;
                              if (((tls->field_7).server.early_data !=
                                   (st_ptls_early_data_receiver_t *)0x0) &&
                                 ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0))
                              {
                                capacity_15._6_2_ = 0x2a;
                                capacity_15._4_1_ = 0;
                                capacity_15._5_1_ = 0x2a;
                                local_20c = ptls_buffer__do_pushv
                                                      ((ptls_buffer_t *)ch.psk._176_8_,
                                                       (void *)((long)&capacity_15 + 4),2);
                                if (local_20c != 0) goto LAB_0011b13b;
                                body_start_15 = 2;
                                local_20c = ptls_buffer__do_pushv
                                                      ((ptls_buffer_t *)ch.psk._176_8_,"",2);
                                if (local_20c != 0) goto LAB_0011b13b;
                                body_size_15 = *(size_t *)(ch.psk._176_8_ + 0x10);
                                body_size_13 = *(long *)(ch.psk._176_8_ + 0x10) - body_size_15;
                                for (; body_start_15 != 0; body_start_15 = body_start_15 - 1) {
                                  *(char *)(*(long *)ch.psk._176_8_ + (body_size_15 - body_start_15)
                                           ) = (char)(body_size_13 >>
                                                     (((char)body_start_15 + -1) * '\b' & 0x3fU));
                                }
                              }
                              local_20c = 0;
                              body_size_12 = *(long *)(ch.psk._176_8_ + 0x10) - lStack_3f0;
                              for (; body_start_13 != 0; body_start_13 = body_start_13 - 1) {
                                *(char *)(*(long *)ch.psk._176_8_ + (lStack_3f0 - body_start_13)) =
                                     (char)(body_size_12 >>
                                           (((char)body_start_13 + -1) * '\b' & 0x3fU));
                              }
                              body_size_11 = *(long *)(ch.psk._176_8_ + 0x10) - capacity_13;
                              for (; body_start_12 != 0; body_start_12 = body_start_12 - 1) {
                                *(char *)(*(long *)ch.psk._176_8_ + (capacity_13 - body_start_12)) =
                                     (char)(body_size_11 >>
                                           (((char)body_start_12 + -1) * '\b' & 0x3fU));
                              }
                              if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                                key_schedule_update_hash
                                          (tls->key_schedule,
                                           (uint8_t *)(*(long *)ch.psk._176_8_ + local_3c8),
                                           *(long *)(ch.psk._176_8_ + 0x10) - local_3c8);
                              }
                              rec_start_1 = *(long *)(ch.psk._176_8_ + 0x10) - mess_start_2;
                              for (; body_start_11 != 0; body_start_11 = body_start_11 - 1) {
                                *(char *)(*(long *)ch.psk._176_8_ + (mess_start_2 - body_start_11))
                                     = (char)(rec_start_1 >>
                                             (((char)body_start_11 + -1) * '\b' & 0x3fU));
                              }
                              local_20c = buffer_encrypt_record
                                                    ((ptls_buffer_t *)ch.psk._176_8_,local_3a8,
                                                     (tls->traffic_protection).enc.aead);
                              if (local_20c == 0) {
                                if (certs._4_4_ == 0) {
                                  local_450 = *(size_t *)(ch.psk._176_8_ + 0x10);
                                  capacity_16._5_1_ = 0x16;
                                  capacity_16._6_1_ = 3;
                                  capacity_16._7_1_ = 1;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,
                                                         (void *)((long)&capacity_16 + 5),3);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  body_start_16 = 2;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,"",2);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  mess_start_3 = *(size_t *)(ch.psk._176_8_ + 0x10);
                                  local_470 = *(long *)(ch.psk._176_8_ + 0x10);
                                  capacity_17._7_1_ = 0xb;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,
                                                         (void *)((long)&capacity_17 + 7),1);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  body_start_17 = 3;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,"",3);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  local_488 = *(long *)(ch.psk._176_8_ + 0x10);
                                  capacity_18._7_1_ = 0;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,
                                                         (void *)((long)&capacity_18 + 7),1);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  body_start_18 = 3;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,"",3);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  i = *(size_t *)(ch.psk._176_8_ + 0x10);
                                  for (capacity_19 = 0; local_20c = 0, capacity_19 != psk_index;
                                      capacity_19 = capacity_19 + 1) {
                                    body_start_19 = 3;
                                    local_20c = ptls_buffer__do_pushv
                                                          ((ptls_buffer_t *)ch.psk._176_8_,"",3);
                                    if (local_20c != 0) goto LAB_0011b13b;
                                    body_size_19 = *(size_t *)(ch.psk._176_8_ + 0x10);
                                    local_20c = ptls_buffer__do_pushv
                                                          ((ptls_buffer_t *)ch.psk._176_8_,
                                                           *(void **)(num_certs + capacity_19 * 0x10
                                                                     ),
                                                           *(size_t *)
                                                            (num_certs + capacity_19 * 0x10 + 8));
                                    if (local_20c != 0) goto LAB_0011b13b;
                                    capacity_20 = *(long *)(ch.psk._176_8_ + 0x10) - body_size_19;
                                    for (; body_start_19 != 0; body_start_19 = body_start_19 - 1) {
                                      *(char *)(*(long *)ch.psk._176_8_ +
                                               (body_size_19 - body_start_19)) =
                                           (char)(capacity_20 >>
                                                 (((char)body_start_19 + -1) * '\b' & 0x3fU));
                                    }
                                    body_start_20 = 2;
                                    local_20c = ptls_buffer__do_pushv
                                                          ((ptls_buffer_t *)ch.psk._176_8_,"",2);
                                    if (local_20c != 0) goto LAB_0011b13b;
                                    body_size_20 = *(size_t *)(ch.psk._176_8_ + 0x10);
                                    body_size_18 = *(long *)(ch.psk._176_8_ + 0x10) - body_size_20;
                                    for (; body_start_20 != 0; body_start_20 = body_start_20 - 1) {
                                      *(char *)(*(long *)ch.psk._176_8_ +
                                               (body_size_20 - body_start_20)) =
                                           (char)(body_size_18 >>
                                                 (((char)body_start_20 + -1) * '\b' & 0x3fU));
                                    }
                                  }
                                  body_size_17 = *(long *)(ch.psk._176_8_ + 0x10) - i;
                                  for (; body_start_18 != 0; body_start_18 = body_start_18 - 1) {
                                    *(char *)(*(long *)ch.psk._176_8_ + (i - body_start_18)) =
                                         (char)(body_size_17 >>
                                               (((char)body_start_18 + -1) * '\b' & 0x3fU));
                                  }
                                  body_size_16 = *(long *)(ch.psk._176_8_ + 0x10) - local_488;
                                  for (; body_start_17 != 0; body_start_17 = body_start_17 - 1) {
                                    *(char *)(*(long *)ch.psk._176_8_ + (local_488 - body_start_17))
                                         = (char)(body_size_16 >>
                                                 (((char)body_start_17 + -1) * '\b' & 0x3fU));
                                  }
                                  if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                                    key_schedule_update_hash
                                              (tls->key_schedule,
                                               (uint8_t *)(*(long *)ch.psk._176_8_ + local_470),
                                               *(long *)(ch.psk._176_8_ + 0x10) - local_470);
                                  }
                                  rec_start_2 = *(long *)(ch.psk._176_8_ + 0x10) - mess_start_3;
                                  for (; body_start_16 != 0; body_start_16 = body_start_16 - 1) {
                                    *(char *)(*(long *)ch.psk._176_8_ +
                                             (mess_start_3 - body_start_16)) =
                                         (char)(rec_start_2 >>
                                               (((char)body_start_16 + -1) * '\b' & 0x3fU));
                                  }
                                  local_20c = buffer_encrypt_record
                                                        ((ptls_buffer_t *)ch.psk._176_8_,local_450,
                                                         (tls->traffic_protection).enc.aead);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  local_4f8 = *(size_t *)(ch.psk._176_8_ + 0x10);
                                  capacity_21._5_1_ = 0x16;
                                  capacity_21._6_1_ = 3;
                                  capacity_21._7_1_ = 1;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,
                                                         (void *)((long)&capacity_21 + 5),3);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  body_start_21 = 2;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,"",2);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  mess_start_4 = *(size_t *)(ch.psk._176_8_ + 0x10);
                                  local_518 = *(long *)(ch.psk._176_8_ + 0x10);
                                  capacity_22._7_1_ = 0xf;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,
                                                         (void *)((long)&capacity_22 + 7),1);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  body_start_22 = 3;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,"",3);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  lStack_530 = *(long *)(ch.psk._176_8_ + 0x10);
                                  capacity_23._6_2_ = signer._6_2_;
                                  capacity_23._4_1_ = (undefined1)((ushort)signer._6_2_ >> 8);
                                  capacity_23._5_1_ = (undefined1)signer._6_2_;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,
                                                         (void *)((long)&capacity_23 + 4),2);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  body_start_23 = 2;
                                  local_20c = ptls_buffer__do_pushv
                                                        ((ptls_buffer_t *)ch.psk._176_8_,"",2);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  lVar1 = *(long *)(ch.psk._176_8_ + 0x10);
                                  len = build_certificate_verify_signdata
                                                  ((uint8_t *)&datalen,tls->key_schedule,
                                                   "TLS 1.3, server CertificateVerify");
                                  uVar4 = ch.psk._176_8_;
                                  pvVar3 = signer_data;
                                  sVar8 = pubkey.len;
                                  pVar9 = ptls_iovec_init(&datalen,len);
                                  body_size_23 = (size_t)pVar9.base;
                                  local_648 = pVar9.len;
                                  local_20c = (*(code *)pvVar3)(sVar8,uVar4,body_size_23,local_648);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                  lVar2 = *(long *)(ch.psk._176_8_ + 0x10);
                                  for (; body_start_23 != 0; body_start_23 = body_start_23 - 1) {
                                    *(char *)(*(long *)ch.psk._176_8_ + (lVar1 - body_start_23)) =
                                         (char)((ulong)(lVar2 - lVar1) >>
                                               (((char)body_start_23 + -1) * '\b' & 0x3fU));
                                  }
                                  lVar1 = *(long *)(ch.psk._176_8_ + 0x10);
                                  for (; body_start_22 != 0; body_start_22 = body_start_22 - 1) {
                                    *(char *)(*(long *)ch.psk._176_8_ + (lStack_530 - body_start_22)
                                             ) = (char)((ulong)(lVar1 - lStack_530) >>
                                                       (((char)body_start_22 + -1) * '\b' & 0x3fU));
                                  }
                                  if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                                    key_schedule_update_hash
                                              (tls->key_schedule,
                                               (uint8_t *)(*(long *)ch.psk._176_8_ + local_518),
                                               *(long *)(ch.psk._176_8_ + 0x10) - local_518);
                                  }
                                  lVar1 = *(long *)(ch.psk._176_8_ + 0x10);
                                  for (; body_start_21 != 0; body_start_21 = body_start_21 - 1) {
                                    *(char *)(*(long *)ch.psk._176_8_ +
                                             (mess_start_4 - body_start_21)) =
                                         (char)(lVar1 - mess_start_4 >>
                                               (((char)body_start_21 + -1) * '\b' & 0x3fU));
                                  }
                                  local_20c = buffer_encrypt_record
                                                        ((ptls_buffer_t *)ch.psk._176_8_,local_4f8,
                                                         (tls->traffic_protection).enc.aead);
                                  if (local_20c != 0) goto LAB_0011b13b;
                                }
                                local_20c = 0;
                                send_finished(tls,(ptls_buffer_t *)ch.psk._176_8_);
                                psVar6 = tls->key_schedule;
                                pVar9 = ptls_iovec_init((void *)0x0,0);
                                local_20c = key_schedule_extract(psVar6,pVar9);
                                if (local_20c != 0) {
                                  return local_20c;
                                }
                                iVar5 = setup_traffic_protection
                                                  (tls,tls->cipher_suite,1,
                                                   "server application traffic secret");
                                if (iVar5 != 0) {
                                  return iVar5;
                                }
                                tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
                                local_20c = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else if (ch._16_8_ == 0) {
    local_20c = 0x28;
  }
  else {
    capacity._5_1_ = 0x16;
    capacity._6_1_ = 3;
    capacity._7_1_ = 1;
    local_20c = ptls_buffer__do_pushv
                          ((ptls_buffer_t *)ch.psk._176_8_,(void *)((long)&capacity + 5),3);
    if (local_20c == 0) {
      body_start = 2;
      local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
      if (local_20c == 0) {
        mess_start = *(size_t *)(ch.psk._176_8_ + 0x10);
        local_240 = *(undefined8 *)(ch.psk._176_8_ + 0x10);
        capacity_1._7_1_ = 6;
        local_20c = ptls_buffer__do_pushv
                              ((ptls_buffer_t *)ch.psk._176_8_,(void *)((long)&capacity_1 + 7),1);
        if (local_20c == 0) {
          body_start_1 = 3;
          local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",3);
          if (local_20c == 0) {
            lStack_258 = *(long *)(ch.psk._176_8_ + 0x10);
            capacity_2._6_2_ = 0x7f12;
            capacity_2._4_1_ = 0x7f;
            capacity_2._5_1_ = 0x12;
            local_20c = ptls_buffer__do_pushv
                                  ((ptls_buffer_t *)ch.psk._176_8_,(void *)((long)&capacity_2 + 4),2
                                  );
            if (local_20c == 0) {
              body_start_2 = 2;
              local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
              if (local_20c == 0) {
                lStack_270 = *(long *)(ch.psk._176_8_ + 0x10);
                capacity_3._6_2_ = 0x28;
                capacity_3._4_1_ = 0;
                capacity_3._5_1_ = 0x28;
                local_20c = ptls_buffer__do_pushv
                                      ((ptls_buffer_t *)ch.psk._176_8_,
                                       (void *)((long)&capacity_3 + 4),2);
                if (local_20c == 0) {
                  body_start_3 = 2;
                  local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
                  if (local_20c == 0) {
                    lStack_288 = *(long *)(ch.psk._176_8_ + 0x10);
                    body_size_3._6_2_ = *(undefined2 *)ch._16_8_;
                    body_size_3._4_1_ = (undefined1)((ushort)body_size_3._6_2_ >> 8);
                    body_size_3._5_1_ = (undefined1)body_size_3._6_2_;
                    local_20c = ptls_buffer__do_pushv
                                          ((ptls_buffer_t *)ch.psk._176_8_,
                                           (void *)((long)&body_size_3 + 4),2);
                    if (local_20c == 0) {
                      uStack_298 = *(long *)(ch.psk._176_8_ + 0x10) - lStack_288;
                      for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
                        *(char *)(*(long *)ch.psk._176_8_ + (lStack_288 - body_start_3)) =
                             (char)(uStack_298 >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
                      }
                      capacity_4._6_2_ = 0xd;
                      capacity_4._4_1_ = 0;
                      capacity_4._5_1_ = 0xd;
                      local_20c = ptls_buffer__do_pushv
                                            ((ptls_buffer_t *)ch.psk._176_8_,
                                             (void *)((long)&capacity_4 + 4),2);
                      if (local_20c == 0) {
                        body_start_4 = 2;
                        local_20c = ptls_buffer__do_pushv((ptls_buffer_t *)ch.psk._176_8_,"",2);
                        if (local_20c == 0) {
                          body_size_4 = *(size_t *)(ch.psk._176_8_ + 0x10);
                          body_size_2 = *(long *)(ch.psk._176_8_ + 0x10) - body_size_4;
                          for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                            *(char *)(*(long *)ch.psk._176_8_ + (body_size_4 - body_start_4)) =
                                 (char)(body_size_2 >> (((char)body_start_4 + -1) * '\b' & 0x3fU));
                          }
                          body_size_1 = *(long *)(ch.psk._176_8_ + 0x10) - lStack_270;
                          for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
                            *(char *)(*(long *)ch.psk._176_8_ + (lStack_270 - body_start_2)) =
                                 (char)(body_size_1 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
                          }
                          body_size = *(long *)(ch.psk._176_8_ + 0x10) - lStack_258;
                          for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                            *(char *)(*(long *)ch.psk._176_8_ + (lStack_258 - body_start_1)) =
                                 (char)(body_size >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                          }
                          local_2d0 = *(long *)(ch.psk._176_8_ + 0x10) - mess_start;
                          for (; body_start != 0; body_start = body_start - 1) {
                            *(char *)(*(long *)ch.psk._176_8_ + (mess_start - body_start)) =
                                 (char)(local_2d0 >> (((char)body_start + -1) * '\b' & 0x3fU));
                          }
                          local_20c = 0x202;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011b13b:
  free((void *)ecdh_secret.len);
  free(local_1c0);
  (*ptls_clear_memory)(local_208,0x40);
  return local_20c;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_iovec_t message)
{
    struct st_ptls_client_hello_t ch;
    enum { HANDSHAKE_MODE_FULL, HANDSHAKE_MODE_PSK, HANDSHAKE_MODE_PSK_DHE } mode;
    ptls_iovec_t *certs = NULL;
    size_t num_certs = 0, psk_index = SIZE_MAX;
    uint16_t sign_algorithm = 0;
    int (*signer)(void *, ptls_buffer_t *, ptls_iovec_t) = NULL;
    void *signer_data = NULL;
    ptls_iovec_t pubkey = {}, ecdh_secret = {};
    uint8_t finished_key[PTLS_MAX_DIGEST_SIZE];
    int ret;

    assert(tls->key_schedule == NULL);

    /* decode ClientHello */
    if ((ret = decode_client_hello(tls, &ch, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len)) != 0)
        goto Exit;

    tls->key_schedule = key_schedule_new(tls->cipher_suite->hash);

    /* try psk handshake */
    if (tls->ctx->require_dhe_on_psk)
        ch.psk.ke_modes &= ~(1u << PTLS_PSK_KE_MODE_PSK);
    if (ch.psk.hash_end != 0 && (ch.psk.ke_modes & ((1u << PTLS_PSK_KE_MODE_PSK) | (1u << PTLS_PSK_KE_MODE_PSK_DHE))) != 0 &&
        tls->ctx->decrypt_ticket != NULL) {
        key_schedule_update_hash(tls->key_schedule, message.base, ch.psk.hash_end - message.base);
        if ((ret = try_psk_handshake(tls, &psk_index, &ch)) != 0)
            goto Exit;
        key_schedule_update_hash(tls->key_schedule, ch.psk.hash_end, message.base + message.len - ch.psk.hash_end);
    } else {
        key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    }

    /* adjust key_schedule, determine handshake mode */
    if (psk_index == SIZE_MAX) {
        key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0));
        mode = HANDSHAKE_MODE_FULL;
    } else {
        if ((ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK)) != 0) {
            mode = HANDSHAKE_MODE_PSK;
        } else {
            assert((ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0);
            mode = HANDSHAKE_MODE_PSK_DHE;
        }
    }

    if (ch.psk.early_data_indication && tls->ctx->max_early_data_size != 0 && psk_index == 0) {
        if ((tls->server.early_data = malloc(sizeof(*tls->server.early_data))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if ((ret = setup_traffic_protection(tls, tls->cipher_suite, 0, "client early traffic secret")) != 0)
            goto Exit;
    }

    /* send HelloRetryRequest or abort the handshake if failed to obtain the key */
    if (mode != HANDSHAKE_MODE_PSK) {
        if (ch.key_share.algorithm == &key_exchange_no_match) {
            if (ch.negotiated_group != NULL) {
                buffer_push_handshake(sendbuf, NULL, PTLS_HANDSHAKE_TYPE_HELLO_RETRY_REQUEST, {
                    ptls_buffer_push16(sendbuf, PTLS_PROTOCOL_VERSION_DRAFT18);
                    ptls_buffer_push_block(sendbuf, 2, {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE,
                                              { ptls_buffer_push16(sendbuf, ch.negotiated_group->id); });
                        /* Section 4.2.3: Servers which are authenticating via a certificate MUST indicate so by sending the client
                         * an empty "signature_algorithms" extension. */
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {});
                    });
                });
                ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
                goto Exit;
            } else {
                ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                goto Exit;
            }
        }
    }

    /* run post-hello callback to determine certificate, etc. */
    if (mode == HANDSHAKE_MODE_FULL) {
        if ((ret = tls->ctx->lookup_certificate->cb(tls->ctx->lookup_certificate, tls, &sign_algorithm, &signer, &signer_data,
                                                    &certs, &num_certs, tls->server_name, ch.signature_algorithms.list,
                                                    ch.signature_algorithms.count)) != 0)
            goto Exit;
        assert(sign_algorithm != 0);
    }

    /* run key-exchange, to obtain pubkey and secret */
    if (mode != HANDSHAKE_MODE_PSK) {
        if ((ret = ch.key_share.algorithm->exchange(&pubkey, &ecdh_secret, ch.key_share.peer)) != 0)
            goto Exit;
    }

    /* send ServerHello */
    buffer_push_handshake(sendbuf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {
        ptls_buffer_push16(sendbuf, PTLS_PROTOCOL_VERSION_DRAFT18);
        if ((ret = ptls_buffer_reserve(sendbuf, PTLS_HELLO_RANDOM_SIZE)) != 0)
            goto Exit;
        tls->ctx->random_bytes(sendbuf->base + sendbuf->off, PTLS_HELLO_RANDOM_SIZE);
        sendbuf->off += PTLS_HELLO_RANDOM_SIZE;
        ptls_buffer_push16(sendbuf, tls->cipher_suite->id);
        ptls_buffer_push_block(sendbuf, 2, {
            if (mode != HANDSHAKE_MODE_PSK) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                    ptls_buffer_push16(sendbuf, ch.key_share.algorithm->id);
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, pubkey.base, pubkey.len); });
                });
            }
            if (mode != HANDSHAKE_MODE_FULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY,
                                      { ptls_buffer_push16(sendbuf, (uint16_t)psk_index); });
            }
        });
    });

    /* create protection contexts for the handshake */
    key_schedule_extract(tls->key_schedule, ecdh_secret);
    if ((ret = setup_traffic_protection(tls, tls->cipher_suite, 1, "server handshake traffic secret")) != 0)
        goto Exit;
    if (tls->server.early_data != NULL) {
        if ((ret = derive_secret(tls->key_schedule, tls->server.early_data->next_secret, "client handshake traffic secret")) != 0)
            goto Exit;
    } else {
        if ((ret = setup_traffic_protection(tls, tls->cipher_suite, 0, "client handshake traffic secret")) != 0)
            goto Exit;
        if (ch.psk.early_data_indication)
            tls->server.skip_early_data = 1;
    }

    /* send EncryptedExtensions */
    buffer_encrypt(sendbuf, tls->traffic_protection.enc.aead, {
        buffer_push_handshake(sendbuf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, {
            ptls_buffer_push_block(sendbuf, 2, {
                if (tls->server_name != NULL) {
                    /* In this event, the server SHALL include an extension of type "server_name" in the (extended) server hello.
                     * The "extension_data" field of this extension SHALL be empty. (RFC 6066 section 3) */
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {});
                }
                if (tls->server.early_data != NULL && tls->traffic_protection.dec.aead != NULL)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
            });
        });
    });

    if (mode == HANDSHAKE_MODE_FULL) {
        /* send Certificate */
        buffer_encrypt(sendbuf, tls->traffic_protection.enc.aead, {
            buffer_push_handshake(sendbuf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE, {
                ptls_buffer_push(sendbuf, 0);
                ptls_buffer_push_block(sendbuf, 3, {
                    size_t i;
                    for (i = 0; i != num_certs; ++i) {
                        ptls_buffer_push_block(sendbuf, 3, { ptls_buffer_pushv(sendbuf, certs[i].base, certs[i].len); });
                        ptls_buffer_push_block(sendbuf, 2, {}); /* extensions */
                    }
                });
            });
        });
        /* build and send CertificateVerify */
        buffer_encrypt(sendbuf, tls->traffic_protection.enc.aead, {
            buffer_push_handshake(sendbuf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
                ptls_buffer_push16(sendbuf, sign_algorithm);
                ptls_buffer_push_block(sendbuf, 2, {
                    uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                    size_t datalen =
                        build_certificate_verify_signdata(data, tls->key_schedule, PTLS_SERVER_CERTIFICATE_VERIFY_CONTEXT_STRING);
                    if ((ret = signer(signer_data, sendbuf, ptls_iovec_init(data, datalen))) != 0)
                        goto Exit;
                });
            });
        });
    }

    send_finished(tls, sendbuf);

    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        return ret;
    if ((ret = setup_traffic_protection(tls, tls->cipher_suite, 1, "server application traffic secret")) != 0)
        return ret;

    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    ret = 0;

Exit:
    free(pubkey.base);
    free(ecdh_secret.base);
    ptls_clear_memory(finished_key, sizeof(finished_key));
    return ret;
}